

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O2

void __thiscall
kratos::PackedSlice::set_up(PackedSlice *this,PackedStruct *struct_,string *member_name)

{
  pointer pPVar1;
  PackedSlice *pPVar2;
  __type_conflict2 _Var3;
  uint32_t uVar4;
  int iVar5;
  InternalException *this_00;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  pointer this_01;
  uint32_t uVar6;
  basic_string_view<char> bVar7;
  string_view format_str;
  format_args args;
  string local_88;
  pointer local_68;
  size_type sStack_60;
  pointer local_58;
  size_type sStack_50;
  PackedSlice *local_40;
  PackedStruct *local_38;
  
  this_01 = (struct_->attributes).
            super__Vector_base<kratos::PackedStructFieldDef,_std::allocator<kratos::PackedStructFieldDef>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pPVar1 = (struct_->attributes).
           super__Vector_base<kratos::PackedStructFieldDef,_std::allocator<kratos::PackedStructFieldDef>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  uVar6 = 0;
  local_40 = this;
  local_38 = struct_;
  while( true ) {
    if (this_01 == pPVar1) {
      this_00 = (InternalException *)__cxa_allocate_exception(0x10);
      local_68 = (member_name->_M_dataplus)._M_p;
      sStack_60 = member_name->_M_string_length;
      local_58 = (local_38->struct_name)._M_dataplus._M_p;
      sStack_50 = (local_38->struct_name)._M_string_length;
      bVar7 = fmt::v7::to_string_view<char,_0>("{0} does not exist in {1}");
      format_str.data_ = (char *)bVar7.size_;
      format_str.size_ = 0xdd;
      args.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .field_1.args_ = in_R9.args_;
      args.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .desc_ = (unsigned_long_long)&local_68;
      fmt::v7::detail::vformat_abi_cxx11_(&local_88,(detail *)bVar7.data_,format_str,args);
      InternalException::InternalException(this_00,&local_88);
      __cxa_throw(this_00,&InternalException::typeinfo,std::runtime_error::~runtime_error);
    }
    _Var3 = std::operator==(&this_01->name,member_name);
    uVar4 = PackedStructFieldDef::bitwidth(this_01);
    pPVar2 = local_40;
    if (_Var3) break;
    uVar6 = uVar6 + uVar4;
    this_01 = this_01 + 1;
  }
  (local_40->super_VarSlice).high = (uVar4 + uVar6) - 1;
  (local_40->super_VarSlice).low = uVar6;
  (local_40->super_VarSlice).super_Var.is_signed_ = this_01->signed_;
  iVar5 = (*(((local_40->super_VarSlice).parent_var)->super_IRNode)._vptr_IRNode[0x26])();
  (pPVar2->super_VarSlice).var_high_ = (iVar5 + uVar6 + uVar4) - 1;
  uVar6 = (pPVar2->super_VarSlice).low;
  iVar5 = (*(((pPVar2->super_VarSlice).parent_var)->super_IRNode)._vptr_IRNode[0x26])();
  uVar6 = iVar5 + uVar6;
  (pPVar2->super_VarSlice).var_low_ = uVar6;
  (pPVar2->super_VarSlice).super_Var.var_width_ = ((pPVar2->super_VarSlice).var_high_ - uVar6) + 1;
  pPVar2->def_ = this_01;
  return;
}

Assistant:

void PackedSlice::set_up(const kratos::PackedStruct &struct_, const std::string &member_name) {
    // compute the high and low
    uint32_t low_ = 0;
    bool found = false;
    for (auto const &def : struct_.attributes) {
        if (def.name == member_name) {
            found = true;
            high = def.bitwidth() + low_ - 1;
            low = low_;
            is_signed_ = def.signed_;
            var_high_ = high + parent_var->var_low();
            var_low_ = low + parent_var->var_low();
            var_width_ = var_high_ - var_low_ + 1;
            def_ = &def;
            break;
        } else {
            low_ += def.bitwidth();
        }
    }

    if (!found) {
        throw InternalException(
            ::format("{0} does not exist in {1}", member_name, struct_.struct_name));
    }
}